

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,formatv_object_base *Obj)

{
  undefined1 local_a0 [8];
  SmallString<128U> S;
  
  local_a0 = (undefined1  [8])
             &S.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size;
  S.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  formatv_object_base::format(Obj,this);
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_a0);
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const formatv_object_base &Obj) {
  SmallString<128> S;
  Obj.format(*this);
  return *this;
}